

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupAppendCones(Gia_Man_t *p,Gia_Man_t **ppCones,int nCones,int fOnlyRegs)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar17 = 0;
    do {
      iVar4 = pVVar9->pArray[lVar17];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001da857;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar11 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) {
LAB_001da8b4:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001da8b4;
      pGVar2[iVar4].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar9 = p->vCis;
    } while (lVar17 < pVVar9->nSize);
  }
  if (0 < p->nObjs) {
    lVar18 = 8;
    lVar17 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(ulong *)((long)pGVar2 + lVar18 + -8);
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar5 = *(uint *)((long)pGVar2 +
                         lVar18 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        if (((int)uVar5 < 0) ||
           (uVar15 = *(uint *)((long)pGVar2 +
                              lVar18 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar15 < 0)) goto LAB_001da895;
        iVar4 = Gia_ManHashAnd(p_00,uVar5 ^ (uint)(uVar11 >> 0x1d) & 1,
                               uVar15 ^ (uint)(uVar11 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar18) = iVar4;
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar17 < p->nObjs);
  }
  pVVar9 = p->vCos;
  uVar11 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar17 = 0;
    do {
      if ((int)uVar11 <= lVar17) goto LAB_001da876;
      iVar4 = pVVar9->pArray[lVar17];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001da857;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0)
      goto LAB_001da895;
      uVar5 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                   pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value)
      ;
      pGVar2->Value = uVar5;
      lVar17 = lVar17 + 1;
      pVVar9 = p->vCos;
      uVar11 = (ulong)pVVar9->nSize;
    } while (lVar17 < (long)(uVar11 - (long)p->nRegs));
  }
  if (0 < nCones) {
    uVar11 = 0;
    do {
      pGVar10 = ppCones[uVar11];
      if (pGVar10->vCos->nSize - pGVar10->nRegs != 1) {
        __assert_fail("Gia_ManPoNum(pOne) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                      ,0x482,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)"
                     );
      }
      if (pGVar10->nRegs != 0) {
        __assert_fail("Gia_ManRegNum(pOne) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                      ,0x483,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)"
                     );
      }
      iVar4 = pGVar10->vCis->nSize;
      if (fOnlyRegs == 0) {
        if (iVar4 != p->vCis->nSize) {
          __assert_fail("Gia_ManPiNum(pOne) == Gia_ManCiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                        ,0x487,
                        "Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)");
        }
      }
      else if (iVar4 != p->nRegs) {
        __assert_fail("Gia_ManPiNum(pOne) == Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                      ,0x485,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)"
                     );
      }
      pGVar2 = pGVar10->pObjs;
      pGVar2->Value = 0;
      pVVar9 = pGVar10->vCis;
      uVar5 = pVVar9->nSize;
      if (0 < (int)uVar5) {
        uVar12 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar12 = 0;
        }
        uVar14 = 0;
        do {
          if (uVar12 == uVar14) goto LAB_001da876;
          iVar4 = pVVar9->pArray[uVar14];
          if (((long)iVar4 < 0) || (pGVar10->nObjs <= iVar4)) goto LAB_001da857;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar15 = (uint)uVar14;
          if (fOnlyRegs != 0) {
            uVar15 = (p->vCis->nSize + uVar15) - p->nRegs;
          }
          if (((int)uVar15 < 0) || (p_00->vCis->nSize <= (int)uVar15)) goto LAB_001da876;
          iVar13 = p_00->vCis->pArray[uVar15];
          if (((long)iVar13 < 0) || (p_00->nObjs <= iVar13)) goto LAB_001da857;
          pGVar3 = p_00->pObjs;
          pGVar8 = (Gia_Obj_t *)((ulong)(pGVar3 + iVar13) & 0xfffffffffffffffe);
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001da8b4;
          iVar16 = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2);
          if (iVar16 * -0x55555555 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          pGVar2[iVar4].Value = ((uint)(pGVar3 + iVar13) & 1) + iVar16 * 0x55555556;
          uVar14 = uVar14 + 1;
        } while (uVar5 != uVar14);
      }
      if (0 < pGVar10->nObjs) {
        lVar17 = 8;
        lVar18 = 0;
        do {
          pGVar2 = pGVar10->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar12 = *(ulong *)((long)pGVar2 + lVar17 + -8);
          if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
            uVar5 = *(uint *)((long)pGVar2 +
                             lVar17 + (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3);
            if (((int)uVar5 < 0) ||
               (uVar15 = *(uint *)((long)pGVar2 +
                                  lVar17 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar15 < 0)) goto LAB_001da895;
            iVar4 = Gia_ManHashAnd(p_00,uVar5 ^ (uint)(uVar12 >> 0x1d) & 1,
                                   uVar15 ^ (uint)(uVar12 >> 0x3d) & 1);
            *(int *)(&pGVar2->field_0x0 + lVar17) = iVar4;
          }
          lVar18 = lVar18 + 1;
          lVar17 = lVar17 + 0xc;
        } while (lVar18 < pGVar10->nObjs);
      }
      pVVar9 = pGVar10->vCos;
      uVar12 = (ulong)(uint)pVVar9->nSize;
      if (pGVar10->nRegs < pVVar9->nSize) {
        lVar17 = 0;
        do {
          if ((int)uVar12 <= lVar17) goto LAB_001da876;
          iVar4 = pVVar9->pArray[lVar17];
          if (((long)iVar4 < 0) || (pGVar10->nObjs <= iVar4)) goto LAB_001da857;
          if (pGVar10->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = pGVar10->pObjs + iVar4;
          if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0)
          goto LAB_001da895;
          uVar5 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                       pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].
                                       Value);
          pGVar2->Value = uVar5;
          lVar17 = lVar17 + 1;
          pVVar9 = pGVar10->vCos;
          uVar12 = (ulong)pVVar9->nSize;
        } while (lVar17 < (long)(uVar12 - (long)pGVar10->nRegs));
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)nCones);
  }
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar13 = 0;
    do {
      iVar16 = p->vCos->nSize;
      uVar5 = (iVar16 - iVar4) + iVar13;
      if (((int)uVar5 < 0) || (iVar16 <= (int)uVar5)) {
LAB_001da876:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = p->vCos->pArray[uVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_001da857:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_001da895:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                   pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value)
      ;
      pGVar2->Value = uVar5;
      iVar13 = iVar13 + 1;
      iVar4 = p->nRegs;
    } while (iVar13 < iVar4);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManDupAppendCones( Gia_Man_t * p, Gia_Man_t ** ppCones, int nCones, int fOnlyRegs )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i, k;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    for ( k = 0; k < nCones; k++ )
    {
        pOne = ppCones[k];
        assert( Gia_ManPoNum(pOne) == 1 );
        assert( Gia_ManRegNum(pOne) == 0 );
        if ( fOnlyRegs )
            assert( Gia_ManPiNum(pOne) == Gia_ManRegNum(p) );
        else
            assert( Gia_ManPiNum(pOne) == Gia_ManCiNum(p) );
        Gia_ManConst0(pOne)->Value = 0;
        Gia_ManForEachPi( pOne, pObj, i )
            pObj->Value = Gia_ManCiLit( pNew, fOnlyRegs ? Gia_ManPiNum(p) + i : i );
        Gia_ManForEachAnd( pOne, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( pOne, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}